

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_type i;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x15e72f);
    if (sVar1 <= local_18) {
      return false;
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_18)
    ;
    if (*pvVar2 != 0) break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool dynamic_bitset<Block, Allocator>::any() const
{
    for (size_type i = 0; i < num_blocks(); ++i)
        if (m_bits[i])
            return true;
    return false;
}